

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

Point3f __thiscall
ary::unprojectPoint(ary *this,Point2f *p,Matx33f *rotation,Matx31f *translation,Matx33f *intrinsics,
                   Mat *distortion)

{
  bool bVar1;
  int i;
  _InputArray *p_Var2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  int iVar7;
  undefined1 *puVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined8 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar10;
  Point3f PVar11;
  Mat LOS;
  Mat translationInv;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsOut;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsIn;
  Matx<float,_3,_3> b;
  Mat rotationInv;
  Mat intrInv;
  Matx<float,_3,_3> M;
  undefined1 local_588 [12];
  int iStack_57c;
  Size local_578;
  MatSize local_548;
  size_t *local_540;
  Mat local_528;
  float *local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_4a8;
  undefined1 local_488 [16];
  Size SStack_478;
  undefined1 local_428 [8];
  void *pvStack_420;
  Size local_418;
  uchar *puStack_410;
  float local_408;
  Mat local_3b8;
  Mat local_358;
  Mat local_2c8;
  Mat local_268;
  undefined1 local_208 [8];
  void *pvStack_200;
  Size local_1f8;
  uchar *puStack_1f0;
  uchar *local_1e8;
  uchar *puStack_1e0;
  MatAllocator *local_1d8;
  UMatData *pUStack_1d0;
  MatSize local_1c8;
  size_t *local_1c0;
  size_t local_1b8 [2];
  undefined1 local_1a8 [8];
  void *pvStack_1a0;
  Size SStack_198;
  uchar *puStack_190;
  float local_188;
  Mat local_138;
  Mat MStack_d8;
  undefined4 local_48;
  Mat *local_40;
  undefined8 uStack_38;
  
  local_4a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8 = 0;
  local_4c8 = (float *)0x0;
  uStack_4c0 = 0;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back(&local_4a8,p);
  local_418.width = 0;
  local_418.height = 0;
  local_428._0_4_ = -0x7efcfff3;
  SStack_198.width = 0;
  SStack_198.height = 0;
  local_1a8._0_4_ = -0x7dfcfff3;
  pvStack_1a0 = &local_4c8;
  local_488._0_4_ = -0x3efdfffb;
  SStack_478.width = 3;
  SStack_478.height = 3;
  local_578.width = 0;
  local_578.height = 0;
  local_588._0_4_ = 0x1010000;
  unique0x10000e7b = distortion;
  local_488._8_8_ = intrinsics;
  pvStack_420 = &local_4a8;
  p_Var2 = (_InputArray *)cv::noArray();
  local_208._0_4_ = -0x3efdfffb;
  local_1f8.width = 3;
  local_1f8.height = 3;
  pvStack_200 = intrinsics;
  cv::undistortPoints((_InputArray *)local_428,(_OutputArray *)local_1a8,(_InputArray *)local_488,
                      (_InputArray *)local_588,p_Var2,(_InputArray *)local_208);
  cv::Mat::Mat((Mat *)local_588,3,1,5);
  *(float *)local_578 = *local_4c8;
  if ((((uint)local_588._0_4_ >> 0xe & 1) == 0) && (*local_548.p != 1)) {
    if (local_548.p[1] == 1) {
      pfVar5 = (float *)((long)local_578 + *local_540);
    }
    else {
      iVar7 = 0;
      if (iStack_57c + 1U < 3) {
        iVar7 = iStack_57c;
      }
      pfVar5 = (float *)((long)iVar7 * *local_540 + (long)local_578) + (1 - iStack_57c * iVar7);
    }
  }
  else {
    pfVar5 = (float *)((long)local_578 + 4);
  }
  *pfVar5 = local_4c8[1];
  if ((((uint)local_588._0_4_ >> 0xe & 1) == 0) && (*local_548.p != 1)) {
    if (local_548.p[1] == 1) {
      pfVar5 = (float *)(*local_540 * 2 + (long)local_578);
    }
    else {
      pfVar5 = (float *)((long)(int)(2 / (long)iStack_57c) * *local_540 + (long)local_578) +
               (2 % (long)iStack_57c & 0xffffffff);
    }
  }
  else {
    pfVar5 = (float *)((long)local_578 + 8);
  }
  *pfVar5 = 1.0;
  local_418.width = 0;
  local_418.height = 0;
  puStack_410 = (uchar *)0x0;
  local_428 = (undefined1  [8])0x0;
  pvStack_420 = (void *)0x0;
  local_408 = 0.0;
  bVar1 = cv::internal::Matx_FastInvOp<float,_3,_3>::operator()
                    ((Matx_FastInvOp<float,_3,_3> *)local_488,intrinsics,
                     (Matx<float,_3,_3> *)local_428,0);
  if (bVar1) {
    local_188 = local_408;
    SStack_198 = local_418;
    puStack_190 = puStack_410;
    local_1a8 = local_428;
    pvStack_1a0 = pvStack_420;
  }
  else {
    SStack_198.width = 0;
    SStack_198.height = 0;
    puStack_190 = (uchar *)0x0;
    local_1a8 = (undefined1  [8])0x0;
    pvStack_1a0 = (void *)0x0;
    local_188 = 0.0;
  }
  local_1c8.p = (int *)&pvStack_200;
  local_208._0_4_ = 0x42ff4005;
  local_208._4_4_ = 2;
  pvStack_200 = (void *)0x300000003;
  local_1f8.width = 0;
  local_1f8.height = 0;
  puStack_1f0 = (uchar *)0x0;
  local_1e8 = (uchar *)0x0;
  puStack_1e0 = (uchar *)0x0;
  local_1d8 = (MatAllocator *)0x0;
  pUStack_1d0 = (UMatData *)0x0;
  local_1c0 = local_1b8;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  puVar8 = local_1a8;
  cv::Mat::Mat((Mat *)local_428,3,3,5,puVar8,0);
  SStack_478.width = 0;
  SStack_478.height = 0;
  local_488._0_4_ = 0x2010000;
  local_488._8_8_ = (_InputArray *)local_208;
  cv::Mat::copyTo((_OutputArray *)local_428);
  cv::Mat::~Mat((Mat *)local_428);
  cv::operator*((Mat *)local_428,(Mat *)local_208);
  (**(code **)(*(long *)local_428 + 0x18))(local_428,local_428,local_588,0xffffffff);
  cv::Mat::~Mat(&local_358);
  cv::Mat::~Mat(&local_3b8);
  cv::Mat::~Mat((Mat *)&local_418);
  lVar3 = 0;
  do {
    lVar6 = 0;
    pfVar5 = rotation->val;
    do {
      *(float *)(puVar8 + lVar6 * 4) = *pfVar5;
      lVar6 = lVar6 + 1;
      pfVar5 = pfVar5 + 3;
    } while (lVar6 != 3);
    lVar3 = lVar3 + 1;
    puVar8 = puVar8 + 0xc;
    rotation = (Matx33f *)((long)rotation + 4);
  } while (lVar3 != 3);
  local_2c8.size.p = &local_2c8.rows;
  local_2c8.flags = 0x42ff4005;
  local_2c8.dims = 2;
  local_2c8.rows = 3;
  local_2c8.cols = 3;
  local_2c8.data = (uchar *)0x0;
  local_2c8.datastart = (uchar *)0x0;
  local_2c8.dataend = (uchar *)0x0;
  local_2c8.datalimit = (uchar *)0x0;
  local_2c8.allocator = (MatAllocator *)0x0;
  local_2c8.u = (UMatData *)0x0;
  local_2c8.step.p = local_2c8.step.buf;
  local_2c8.step.buf[0] = 0;
  local_2c8.step.buf[1] = 0;
  cv::Mat::Mat((Mat *)local_428,3,3,5,local_1a8,0);
  SStack_478.width = 0;
  SStack_478.height = 0;
  local_488._0_4_ = 0x2010000;
  local_488._8_8_ = &local_2c8;
  cv::Mat::copyTo((_OutputArray *)local_428);
  cv::Mat::~Mat((Mat *)local_428);
  cv::operator-((cv *)local_1a8,&local_2c8);
  local_268.size.p = &local_268.rows;
  local_268.flags = 0x42ff4005;
  local_268.dims = 2;
  local_268.rows = 3;
  local_268.cols = 1;
  local_268.data = (uchar *)0x0;
  local_268.datastart = (uchar *)0x0;
  local_268.dataend = (uchar *)0x0;
  local_268.datalimit = (uchar *)0x0;
  local_268.allocator = (MatAllocator *)0x0;
  local_268.u = (UMatData *)0x0;
  local_268.step.p = local_268.step.buf;
  local_268.step.buf[0] = 0;
  local_268.step.buf[1] = 0;
  cv::Mat::Mat((Mat *)local_488,3,1,5,translation,0);
  uStack_38 = 0;
  local_48 = 0x2010000;
  local_40 = &local_268;
  cv::Mat::copyTo((_OutputArray *)local_488);
  cv::Mat::~Mat((Mat *)local_488);
  cv::operator*((MatExpr *)local_428,(Mat *)local_1a8);
  cv::Mat::Mat(&local_528);
  (**(code **)(*(long *)local_428 + 0x18))(local_428,local_428,&local_528,0xffffffff);
  cv::Mat::~Mat(&local_358);
  cv::Mat::~Mat(&local_3b8);
  cv::Mat::~Mat((Mat *)&local_418);
  cv::Mat::~Mat(&local_268);
  cv::Mat::~Mat(&MStack_d8);
  cv::Mat::~Mat(&local_138);
  cv::Mat::~Mat((Mat *)&SStack_198);
  cv::operator*((Mat *)local_428,&local_2c8);
  (**(code **)(*(long *)local_428 + 0x18))(local_428,local_428,local_588,0xffffffff);
  cv::Mat::~Mat(&local_358);
  cv::Mat::~Mat(&local_3b8);
  cv::Mat::~Mat((Mat *)&local_418);
  if (((local_528.flags & 0x4000U) == 0) && (*local_528.size.p != 1)) {
    if (local_528.size.p[1] == 1) {
      pfVar5 = (float *)(*local_528.step.p * 2 + (long)local_528.data);
    }
    else {
      pfVar5 = (float *)((long)local_528.data +
                        (2 % (long)local_528.cols & 0xffffffffU) * 4 +
                        (long)(int)(2 / (long)local_528.cols) * *local_528.step.p);
    }
  }
  else {
    pfVar5 = (float *)((long)local_528.data + 8);
  }
  if (((local_588._0_4_ & 0x4000) == 0) && (*local_548.p != 1)) {
    if (local_548.p[1] == 1) {
      pfVar4 = (float *)(*local_540 * 2 + (long)local_578);
    }
    else {
      pfVar4 = (float *)((long)(int)(2 / (long)iStack_57c) * *local_540 + (long)local_578) +
               (2 % (long)iStack_57c & 0xffffffff);
    }
  }
  else {
    pfVar4 = (float *)((long)local_578 + 8);
  }
  local_418.width = 0;
  local_418.height = 0;
  local_428._0_4_ = 0x2010000;
  fVar10 = 0.0;
  pvStack_420 = local_588;
  cv::Mat::convertTo((_OutputArray *)local_588,(int)local_428,(double)(-*pfVar5 / *pfVar4),0.0);
  *(undefined8 *)this = 0;
  *(undefined4 *)(this + 8) = 0;
  *(float *)this = *(float *)local_578 + *(float *)local_528.data;
  if ((((uint)local_588._0_4_ >> 0xe & 1) == 0) && (*local_548.p != 1)) {
    if (local_548.p[1] == 1) {
      pfVar5 = (float *)((long)local_578 + *local_540);
    }
    else {
      iVar7 = 0;
      if (iStack_57c + 1U < 3) {
        iVar7 = iStack_57c;
      }
      pfVar5 = (float *)((long)iVar7 * *local_540 + (long)local_578) + (1 - iStack_57c * iVar7);
    }
  }
  else {
    pfVar5 = (float *)((long)local_578 + 4);
  }
  if ((((uint)local_528.flags >> 0xe & 1) == 0) && (*local_528.size.p != 1)) {
    if (local_528.size.p[1] == 1) {
      pfVar4 = (float *)((long)local_528.data + *local_528.step.p);
    }
    else {
      iVar7 = 0;
      if (local_528.cols + 1U < 3) {
        iVar7 = local_528.cols;
      }
      pfVar4 = (float *)((long)local_528.data +
                        (long)(1 - local_528.cols * iVar7) * 4 + (long)iVar7 * *local_528.step.p);
    }
  }
  else {
    pfVar4 = (float *)((long)local_528.data + 4);
  }
  *(float *)(this + 4) = *pfVar5 + *pfVar4;
  if ((((uint)local_588._0_4_ >> 0xe & 1) == 0) && (*local_548.p != 1)) {
    if (local_548.p[1] == 1) {
      pfVar5 = (float *)(*local_540 * 2 + (long)local_578);
    }
    else {
      pfVar5 = (float *)((long)(int)(2 / (long)iStack_57c) * *local_540 + (long)local_578) +
               (2 % (long)iStack_57c & 0xffffffff);
    }
  }
  else {
    pfVar5 = (float *)((long)local_578 + 8);
  }
  if ((((uint)local_528.flags >> 0xe & 1) == 0) && (*local_528.size.p != 1)) {
    if (local_528.size.p[1] == 1) {
      pfVar4 = (float *)(*local_528.step.p * 2 + (long)local_528.data);
    }
    else {
      pfVar4 = (float *)((long)local_528.data +
                        (2 % (long)local_528.cols & 0xffffffffU) * 4 +
                        (long)(int)(2 / (long)local_528.cols) * *local_528.step.p);
    }
  }
  else {
    pfVar4 = (float *)((long)local_528.data + 8);
  }
  *(float *)(this + 8) = *pfVar5 + *pfVar4;
  cv::Mat::~Mat(&local_528);
  cv::Mat::~Mat(&local_2c8);
  cv::Mat::~Mat((Mat *)local_208);
  uVar9 = cv::Mat::~Mat((Mat *)local_588);
  if (local_4c8 != (float *)0x0) {
    operator_delete(local_4c8);
    uVar9 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  if (local_4a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a8.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar9 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  PVar11.z = fVar10;
  PVar11.x = (float)(int)uVar9;
  PVar11.y = (float)(int)((ulong)uVar9 >> 0x20);
  return PVar11;
}

Assistant:

Point3f unprojectPoint(Point2f p, const Matx33f& rotation, const Matx31f& translation, const Matx33f& intrinsics, const Mat& distortion) {

	std::vector<Point2f> ptsIn, ptsOut;
    ptsIn.push_back(p);
    undistortPoints(ptsIn, ptsOut, intrinsics, distortion, noArray(), intrinsics);

    float x = ptsOut[0].x;
    float y = ptsOut[0].y;

    Mat LOS(3,1,CV_32F);

    LOS.at<float>(0) = ptsOut[0].x;
    LOS.at<float>(1) = ptsOut[0].y;
    LOS.at<float>(2) = 1;

	Mat intrInv = Mat(intrinsics.inv());
    LOS = intrInv * LOS;

    Mat rotationInv = Mat(rotation.t());
    Mat translationInv = (-rotationInv * Mat(translation));
	LOS = rotationInv * LOS;

	LOS *= -(translationInv.at<float>(2) / LOS.at<float>(2));
	Point3f r;

	r.x = LOS.at<float>(0) + translationInv.at<float>(0);
	r.y = LOS.at<float>(1) + translationInv.at<float>(1);
	r.z = LOS.at<float>(2) + translationInv.at<float>(2);

	return r;
}